

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rank.cc
# Opt level: O0

void __thiscall rank::Rank::add(Rank *this,KeyValue *kv)

{
  Key key;
  iterator iVar1;
  iterator iVar2;
  KeyValue *this_00;
  Value v;
  Entry local_38;
  Entry *local_20;
  Entry *r;
  KeyValue *kv_local;
  Rank *this_local;
  
  r = (Entry *)kv;
  kv_local = (KeyValue *)this;
  key = KeyValue::key(kv);
  local_20 = find(this,key);
  if (local_20 == (Entry *)0x0) {
    Entry::Entry(&local_38,r->_key_value);
    std::vector<rank::Entry,_std::allocator<rank::Entry>_>::push_back(&this->_entries,&local_38);
    iVar1 = std::vector<rank::Entry,_std::allocator<rank::Entry>_>::begin(&this->_entries);
    iVar2 = std::vector<rank::Entry,_std::allocator<rank::Entry>_>::end(&this->_entries);
    std::
    sort<__gnu_cxx::__normal_iterator<rank::Entry*,std::vector<rank::Entry,std::allocator<rank::Entry>>>>
              ((__normal_iterator<rank::Entry_*,_std::vector<rank::Entry,_std::allocator<rank::Entry>_>_>
                )iVar1._M_current,
               (__normal_iterator<rank::Entry_*,_std::vector<rank::Entry,_std::allocator<rank::Entry>_>_>
                )iVar2._M_current);
    this->_dirty = true;
  }
  else {
    this_00 = Entry::key_value(local_20);
    v = KeyValue::value(&r->_key_value);
    KeyValue::value_add(this_00,v);
    iVar1 = std::vector<rank::Entry,_std::allocator<rank::Entry>_>::begin(&this->_entries);
    iVar2 = std::vector<rank::Entry,_std::allocator<rank::Entry>_>::end(&this->_entries);
    std::
    sort<__gnu_cxx::__normal_iterator<rank::Entry*,std::vector<rank::Entry,std::allocator<rank::Entry>>>>
              ((__normal_iterator<rank::Entry_*,_std::vector<rank::Entry,_std::allocator<rank::Entry>_>_>
                )iVar1._M_current,
               (__normal_iterator<rank::Entry_*,_std::vector<rank::Entry,_std::allocator<rank::Entry>_>_>
                )iVar2._M_current);
    this->_dirty = true;
  }
  return;
}

Assistant:

void Rank::add(const KeyValue& kv) {
        auto r = find(kv.key());
        if (!r) {
            _entries.push_back(Entry{kv});
            std::sort(_entries.begin(),_entries.end());
            _dirty = true;
        }
        else {
            r->key_value().value_add(kv.value());
            std::sort(_entries.begin(),_entries.end());
            _dirty = true;
        }
    }